

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetLinearSolutionScaling(void *arkode_mem,int onoff)

{
  undefined4 in_ESI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  local_4 = arkLs_AccessLMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if (*(int *)((long)in_stack_ffffffffffffffd8 + 4) == 0) {
      local_4 = -3;
    }
    else {
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x24) = in_ESI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkLSSetLinearSolutionScaling(void *arkode_mem, booleantype onoff)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetLinearSolutionScaling",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check for valid solver type */
  if (!(arkls_mem->matrixbased)) return(ARKLS_ILL_INPUT);

  /* set solution scaling flag */
  arkls_mem->scalesol = onoff;

  return(ARKLS_SUCCESS);
}